

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseEncodingDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr in;
  xmlChar *pxVar2;
  xmlParserInputBufferPtr pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlCharEncodingHandlerPtr handler;
  
  xmlSkipBlankChars(ctxt);
  in = ctxt->input;
  pxVar5 = in->cur;
  if (*pxVar5 != 'e') {
    return (xmlChar *)0x0;
  }
  if (pxVar5[1] != 'n') {
    return (xmlChar *)0x0;
  }
  if (pxVar5[2] != 'c') {
    return (xmlChar *)0x0;
  }
  if (pxVar5[3] != 'o') {
    return (xmlChar *)0x0;
  }
  if (pxVar5[4] != 'd') {
    return (xmlChar *)0x0;
  }
  if (pxVar5[5] != 'i') {
    return (xmlChar *)0x0;
  }
  if (pxVar5[6] != 'n') {
    return (xmlChar *)0x0;
  }
  if (pxVar5[7] != 'g') {
    return (xmlChar *)0x0;
  }
  in->cur = pxVar5 + 8;
  in->col = in->col + 8;
  if (pxVar5[8] == '\0') {
    xmlParserInputGrow(in,0xfa);
  }
  xmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur != '=') {
    xmlFatalErr(ctxt,XML_ERR_EQUAL_REQUIRED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  xmlNextChar(ctxt);
  xmlSkipBlankChars(ctxt);
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '\'') {
    xmlNextChar(ctxt);
    pxVar5 = xmlParseEncName(ctxt);
    if (*ctxt->input->cur != '\'') {
LAB_0015f523:
      xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
      goto LAB_0015f5f9;
    }
LAB_0015f4e2:
    xmlNextChar(ctxt);
  }
  else {
    if (xVar1 == '\"') {
      xmlNextChar(ctxt);
      pxVar5 = xmlParseEncName(ctxt);
      if (*ctxt->input->cur != '\"') goto LAB_0015f523;
      goto LAB_0015f4e2;
    }
    pxVar5 = (xmlChar *)0x0;
    xmlFatalErr(ctxt,XML_ERR_STRING_NOT_STARTED,(char *)0x0);
  }
  if ((ctxt->options & 0x200000) == 0) {
    if (pxVar5 == (xmlChar *)0x0) {
      return (xmlChar *)0x0;
    }
    iVar4 = xmlStrcasecmp(pxVar5,(xmlChar *)"UTF-16");
    if ((iVar4 == 0) || (iVar4 = xmlStrcasecmp(pxVar5,(xmlChar *)"UTF16"), iVar4 == 0)) {
      if ((ctxt->encoding == (xmlChar *)0x0) &&
         ((pxVar3 = ctxt->input->buf, pxVar3 != (xmlParserInputBufferPtr)0x0 &&
          (pxVar3->encoder == (xmlCharEncodingHandlerPtr)0x0)))) {
        xmlFatalErrMsg(ctxt,XML_ERR_INVALID_ENCODING,
                       "Document labelled UTF-16 but has UTF-8 content\n");
      }
    }
    else {
      iVar4 = xmlStrcasecmp(pxVar5,"UTF-8");
      if ((iVar4 != 0) && (iVar4 = xmlStrcasecmp(pxVar5,(xmlChar *)"UTF8"), iVar4 != 0)) {
        pxVar2 = ctxt->input->encoding;
        if (pxVar2 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar2);
        }
        ctxt->input->encoding = pxVar5;
        handler = xmlFindCharEncodingHandler((char *)pxVar5);
        if (handler != (xmlCharEncodingHandlerPtr)0x0) {
          iVar4 = xmlSwitchToEncoding(ctxt,handler);
          if (iVar4 < 0) {
            ctxt->errNo = 0x20;
            return (xmlChar *)0x0;
          }
          return pxVar5;
        }
        xmlFatalErrMsgStr(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding %s\n",pxVar5);
        return (xmlChar *)0x0;
      }
    }
    if (ctxt->encoding != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->encoding);
    }
    ctxt->encoding = pxVar5;
    return pxVar5;
  }
LAB_0015f5f9:
  (*xmlFree)(pxVar5);
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseEncodingDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *encoding = NULL;

    SKIP_BLANKS;
    if (CMP8(CUR_PTR, 'e', 'n', 'c', 'o', 'd', 'i', 'n', 'g')) {
	SKIP(8);
	SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(NULL);
        }
	NEXT;
	SKIP_BLANKS;
	if (RAW == '"') {
	    NEXT;
	    encoding = xmlParseEncName(ctxt);
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
		xmlFree((xmlChar *) encoding);
		return(NULL);
	    } else
	        NEXT;
	} else if (RAW == '\''){
	    NEXT;
	    encoding = xmlParseEncName(ctxt);
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
		xmlFree((xmlChar *) encoding);
		return(NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
	}

        /*
         * Non standard parsing, allowing the user to ignore encoding
         */
        if (ctxt->options & XML_PARSE_IGNORE_ENC) {
	    xmlFree((xmlChar *) encoding);
            return(NULL);
	}

	/*
	 * UTF-16 encoding switch has already taken place at this stage,
	 * more over the little-endian/big-endian selection is already done
	 */
        if ((encoding != NULL) &&
	    ((!xmlStrcasecmp(encoding, BAD_CAST "UTF-16")) ||
	     (!xmlStrcasecmp(encoding, BAD_CAST "UTF16")))) {
	    /*
	     * If no encoding was passed to the parser, that we are
	     * using UTF-16 and no decoder is present i.e. the
	     * document is apparently UTF-8 compatible, then raise an
	     * encoding mismatch fatal error
	     */
	    if ((ctxt->encoding == NULL) &&
	        (ctxt->input->buf != NULL) &&
	        (ctxt->input->buf->encoder == NULL)) {
		xmlFatalErrMsg(ctxt, XML_ERR_INVALID_ENCODING,
		  "Document labelled UTF-16 but has UTF-8 content\n");
	    }
	    if (ctxt->encoding != NULL)
		xmlFree((xmlChar *) ctxt->encoding);
	    ctxt->encoding = encoding;
	}
	/*
	 * UTF-8 encoding is handled natively
	 */
        else if ((encoding != NULL) &&
	    ((!xmlStrcasecmp(encoding, BAD_CAST "UTF-8")) ||
	     (!xmlStrcasecmp(encoding, BAD_CAST "UTF8")))) {
	    if (ctxt->encoding != NULL)
		xmlFree((xmlChar *) ctxt->encoding);
	    ctxt->encoding = encoding;
	}
	else if (encoding != NULL) {
	    xmlCharEncodingHandlerPtr handler;

	    if (ctxt->input->encoding != NULL)
		xmlFree((xmlChar *) ctxt->input->encoding);
	    ctxt->input->encoding = encoding;

            handler = xmlFindCharEncodingHandler((const char *) encoding);
	    if (handler != NULL) {
		if (xmlSwitchToEncoding(ctxt, handler) < 0) {
		    /* failed to convert */
		    ctxt->errNo = XML_ERR_UNSUPPORTED_ENCODING;
		    return(NULL);
		}
	    } else {
		xmlFatalErrMsgStr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
			"Unsupported encoding %s\n", encoding);
		return(NULL);
	    }
	}
    }
    return(encoding);
}